

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::UFFAdapter::makeUFF
          (UFFAdapter *this,RealType r1,RealType theta0,RealType x1,RealType D1,RealType zeta,
          RealType Z1,RealType Vi,RealType Uj,RealType Xi,RealType Hard,RealType Radius)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_98 [40];
  RealType local_70;
  RealType local_68;
  RealType local_60;
  RealType local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  RealType local_30;
  RealType local_28;
  RealType local_20;
  
  bVar1 = isUFF(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)UFFtypeID_abi_cxx11_);
  }
  local_30 = Xi;
  local_28 = Hard;
  local_20 = Radius;
  this_00 = this->at_;
  local_70 = r1;
  local_68 = theta0;
  local_60 = x1;
  local_58 = D1;
  local_50 = zeta;
  local_48 = Z1;
  local_40 = Vi;
  local_38 = Uj;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,std::__cxx11::string_const&,OpenMD::UFFAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             (UFFAtypeParameters *)UFFtypeID_abi_cxx11_);
  local_98._16_8_ = local_98._0_8_;
  local_98._24_8_ = local_98._8_8_;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_98 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  return;
}

Assistant:

void UFFAdapter::makeUFF(RealType r1, RealType theta0, RealType x1,
                           RealType D1, RealType zeta, RealType Z1, RealType Vi,
                           RealType Uj, RealType Xi, RealType Hard,
                           RealType Radius) {
    if (isUFF()) { at_->removeProperty(UFFtypeID); }

    UFFAtypeParameters uffParam {};

    uffParam.r1     = r1;
    uffParam.theta0 = theta0;
    uffParam.x1     = x1;
    uffParam.D1     = D1;
    uffParam.zeta   = zeta;
    uffParam.Z1     = Z1;
    uffParam.Vi     = Vi;
    uffParam.Uj     = Uj;
    uffParam.Xi     = Xi;
    uffParam.Hard   = Hard;
    uffParam.Radius = Radius;
    at_->addProperty(std::make_shared<UFFAtypeData>(UFFtypeID, uffParam));
  }